

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateIsInitialized
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  long lVar1;
  char cVar2;
  bool bVar3;
  JavaType JVar4;
  FieldGeneratorInfo *pFVar5;
  Descriptor *pDVar6;
  long lVar7;
  long lVar8;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  
  text._M_str = "private byte memoizedIsInitialized = -1;\n";
  text._M_len = 0x29;
  io::Printer::Print<>(printer,text);
  text_00._M_str = "@java.lang.Override\npublic final boolean isInitialized() {\n";
  text_00._M_len = 0x3b;
  io::Printer::Print<>(printer,text_00);
  *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58);
  text_01._M_str =
       "byte isInitialized = memoizedIsInitialized;\nif (isInitialized == 1) return true;\nif (isInitialized == 0) return false;\n\n"
  ;
  text_01._M_len = 0x78;
  io::Printer::Print<>(printer,text_01);
  pDVar6 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar6 + 4)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pFVar5 = Context::GetFieldGeneratorInfo
                         (this->context_,(FieldDescriptor *)(*(long *)(pDVar6 + 0x38) + lVar7));
      cVar2 = google::protobuf::FieldDescriptor::is_required();
      if (cVar2 != '\0') {
        text_02._M_str = "if (!has$name$()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n";
        text_02._M_len = 0x43;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,text_02,(char (*) [5])0x467b4f,&pFVar5->capitalized_name);
      }
      lVar8 = lVar8 + 1;
      pDVar6 = (this->super_MessageGenerator).descriptor_;
      lVar7 = lVar7 + 0x58;
    } while (lVar8 < *(int *)(pDVar6 + 4));
    if (0 < *(int *)(pDVar6 + 4)) {
      lVar8 = 0;
      lVar7 = 0;
      do {
        lVar1 = *(long *)(pDVar6 + 0x38);
        field = (FieldDescriptor *)(lVar1 + lVar8);
        Context::GetFieldGeneratorInfo(this->context_,field);
        JVar4 = GetJavaType(field);
        if (JVar4 == JAVATYPE_MESSAGE) {
          pDVar6 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
          bVar3 = HasRequiredFields(pDVar6);
          if (bVar3) {
            (*(code *)(&DAT_00418d08 +
                      *(int *)(&DAT_00418d08 + (ulong)(*(byte *)(lVar1 + 1 + lVar8) >> 6) * 4)))();
            return;
          }
        }
        lVar7 = lVar7 + 1;
        pDVar6 = (this->super_MessageGenerator).descriptor_;
        lVar8 = lVar8 + 0x58;
      } while (lVar7 < *(int *)(pDVar6 + 4));
    }
  }
  if (0 < *(int *)(pDVar6 + 0x88)) {
    text_03._M_str =
         "if (!extensionsAreInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n";
    text_03._M_len = 0x52;
    io::Printer::Print<>(printer,text_03);
  }
  google::protobuf::io::Printer::Outdent();
  text_04._M_str = "  memoizedIsInitialized = 1;\n";
  text_04._M_len = 0x1d;
  io::Printer::Print<>(printer,text_04);
  text_05._M_str = "  return true;\n}\n\n";
  text_05._M_len = 0x12;
  io::Printer::Print<>(printer,text_05);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateIsInitialized(io::Printer* printer) {
  // Memoizes whether the protocol buffer is fully initialized (has all
  // required fields). -1 means not yet computed. 0 means false and 1 means
  // true.
  printer->Print("private byte memoizedIsInitialized = -1;\n");
  printer->Print(
      "@java.lang.Override\n"
      "public final boolean isInitialized() {\n");
  printer->Indent();

  // Don't directly compare to -1 to avoid an Android x86 JIT bug.
  printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized == 1) return true;\n"
      "if (isInitialized == 0) return false;\n"
      "\n");

  // Check that all required fields in this message are set.
  // TODO:  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
          "if (!has$name$()) {\n"
          "  memoizedIsInitialized = 0;\n"
          "  return false;\n"
          "}\n",
          "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
              "if (!get$name$().isInitialized()) {\n"
              "  memoizedIsInitialized = 0;\n"
              "  return false;\n"
              "}\n",
              "type",
              name_resolver_->GetImmutableClassName(field->message_type()),
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          printer->Print(
              "if (has$name$()) {\n"
              "  if (!get$name$().isInitialized()) {\n"
              "    memoizedIsInitialized = 0;\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_REPEATED:
          if (IsMapEntry(field->message_type())) {
            printer->Print(
                "for ($type$ item : get$name$Map().values()) {\n"
                "  if (!item.isInitialized()) {\n"
                "    memoizedIsInitialized = 0;\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                MapValueImmutableClassdName(field->message_type(),
                                            name_resolver_),
                "name", info->capitalized_name);
          } else {
            printer->Print(
                "for (int i = 0; i < get$name$Count(); i++) {\n"
                "  if (!get$name$(i).isInitialized()) {\n"
                "    memoizedIsInitialized = 0;\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                name_resolver_->GetImmutableClassName(field->message_type()),
                "name", info->capitalized_name);
          }
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!extensionsAreInitialized()) {\n"
        "  memoizedIsInitialized = 0;\n"
        "  return false;\n"
        "}\n");
  }

  printer->Outdent();

  printer->Print("  memoizedIsInitialized = 1;\n");

  printer->Print(
      "  return true;\n"
      "}\n"
      "\n");
}